

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

string * __thiscall
spvtools::utils::CardinalToOrdinal_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,size_t cardinal)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  char *pcVar4;
  size_type *psVar5;
  utils *puVar6;
  string suffix;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_48;
  
  puVar6 = this + ((ulong)this / 5 & 0xfffffffffffffffe) * -5;
  uVar2 = (ulong)this % 100;
  local_60 = 0;
  local_58 = 0;
  if (puVar6 == (utils *)0x1 && uVar2 != 0xb) {
    pcVar4 = "st";
  }
  else if (puVar6 == (utils *)0x2 && uVar2 != 0xc) {
    pcVar4 = "nd";
  }
  else {
    pcVar4 = "rd";
    if (uVar2 == 0xd) {
      pcVar4 = "th";
    }
    if (puVar6 != (utils *)0x3) {
      pcVar4 = "th";
    }
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)pcVar4);
  ToString<unsigned_long>(&local_48,(unsigned_long)this);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CardinalToOrdinal(size_t cardinal) {
  const size_t mod10 = cardinal % 10;
  const size_t mod100 = cardinal % 100;
  std::string suffix;
  if (mod10 == 1 && mod100 != 11)
    suffix = "st";
  else if (mod10 == 2 && mod100 != 12)
    suffix = "nd";
  else if (mod10 == 3 && mod100 != 13)
    suffix = "rd";
  else
    suffix = "th";

  return ToString(cardinal) + suffix;
}